

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::FunctionBody::GetStatementIndexAndLengthAt
          (FunctionBody *this,int byteCodeOffset,UINT32 *statementIndex,UINT32 *statementLength)

{
  SRCINFO *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  StatementMap *pSVar6;
  Utf8SourceInfo *pUVar7;
  
  if (statementIndex == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd8,"(statementIndex != nullptr)","statementIndex != nullptr");
    if (!bVar3) goto LAB_006ccc97;
    *puVar5 = 0;
  }
  if (statementLength == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd9,"(statementLength != nullptr)","statementLength != nullptr");
    if (!bVar3) goto LAB_006ccc97;
    *puVar5 = 0;
  }
  bVar3 = FunctionProxy::IsInDebugMode((FunctionProxy *)this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcdb,"(this->IsInDebugMode())","this->IsInDebugMode()");
    if (!bVar3) goto LAB_006ccc97;
    *puVar5 = 0;
  }
  pSVar6 = GetEnclosingStatementMapFromByteCode(this,byteCodeOffset,false);
  if (pSVar6 == (StatementMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcde,"(statement != nullptr)","statement != nullptr");
    if (!bVar3) {
LAB_006ccc97:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  else {
    pUVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    if (pUVar7 == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xce7,"(m_utf8SourceInfo)","m_utf8SourceInfo");
      if (!bVar3) goto LAB_006ccc97;
      *puVar5 = 0;
      pUVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    }
    pSVar1 = (pUVar7->m_srcInfo).ptr;
    if (pSVar1 == (SRCINFO *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = pSVar1->ulCharOffset - pSVar1->ichMinHost;
    }
    *statementIndex = iVar4 + (pSVar6->sourceSpan).begin;
    *statementLength = (pSVar6->sourceSpan).end - (pSVar6->sourceSpan).begin;
  }
  return pSVar6 != (StatementMap *)0x0;
}

Assistant:

bool FunctionBody::GetStatementIndexAndLengthAt(int byteCodeOffset, UINT32* statementIndex, UINT32* statementLength)
    {
        Assert(statementIndex != nullptr);
        Assert(statementLength != nullptr);

        Assert(this->IsInDebugMode());

        StatementMap * statement = GetEnclosingStatementMapFromByteCode(byteCodeOffset, false);
        Assert(statement != nullptr);

        // Bailout if we are unable to find a statement.
        // We shouldn't be missing these when a debugger is attached but we don't want to AV on retail builds.
        if (statement == nullptr)
        {
            return false;
        }

        Assert(m_utf8SourceInfo);
        const SRCINFO * srcInfo = GetUtf8SourceInfo()->GetSrcInfo();

        // Offset from the beginning of the document minus any host-supplied source characters.
        // Host supplied characters are inserted (for example) around onload:
        //      onload="foo('somestring', 0)" -> function onload(event).{.foo('somestring', 0).}
        ULONG offsetFromDocumentBegin = srcInfo ? srcInfo->ulCharOffset - srcInfo->ichMinHost : 0;

        *statementIndex = statement->sourceSpan.Begin() + offsetFromDocumentBegin;
        *statementLength = statement->sourceSpan.End() - statement->sourceSpan.Begin();
        return true;
    }